

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubD::DeleteComponents(ON_SubD *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count)

{
  uint uVar1;
  ON_SubDComponentPtr *cptr_list_00;
  undefined1 local_40 [8];
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  size_t ci_count_local;
  ON_COMPONENT_INDEX *ci_list_local;
  ON_SubD *this_local;
  
  cptr_list._16_8_ = ci_count;
  ON_SimpleArray<ON_SubDComponentPtr>::ON_SimpleArray
            ((ON_SimpleArray<ON_SubDComponentPtr> *)local_40);
  uVar1 = ComponentPtrFromComponentIndex
                    (this,ci_list,cptr_list._16_8_,(ON_SimpleArray<ON_SubDComponentPtr> *)local_40);
  if (uVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    cptr_list_00 = ON_SimpleArray<ON_SubDComponentPtr>::Array
                             ((ON_SimpleArray<ON_SubDComponentPtr> *)local_40);
    uVar1 = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount
                      ((ON_SimpleArray<ON_SubDComponentPtr> *)local_40);
    this_local._7_1_ = DeleteComponents(this,cptr_list_00,(ulong)uVar1,false);
  }
  ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray
            ((ON_SimpleArray<ON_SubDComponentPtr> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::DeleteComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count
  )
{
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  if (ComponentPtrFromComponentIndex(ci_list,ci_count,cptr_list) <= 0)
    return true; // nothing to delete

  return DeleteComponents(cptr_list.Array(),cptr_list.UnsignedCount(),false);
}